

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O3

void kbd_callback(char *name,int name_len,char *instruction,int instruction_len,int num_prompts,
                 LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses
                 ,void **abstract)

{
  size_t sVar1;
  char *pcVar2;
  ulong uVar3;
  undefined8 local_440;
  char buf [1024];
  
  local_440 = prompts;
  fwrite("Performing keyboard-interactive authentication.\n",0x30,1,_stderr);
  fwrite("Authentication name: \'",0x16,1,_stderr);
  fwrite(name,1,(long)name_len,_stderr);
  fwrite("\'\n",2,1,_stderr);
  fwrite("Authentication instruction: \'",0x1d,1,_stderr);
  fwrite(instruction,1,(long)instruction_len,_stderr);
  fwrite("\'\n",2,1,_stderr);
  fprintf(_stderr,"Number of prompts: %d\n\n",(ulong)(uint)num_prompts);
  if (0 < num_prompts) {
    uVar3 = 0;
    do {
      fprintf(_stderr,"Prompt %d from server: \'",uVar3 & 0xffffffff);
      fwrite(local_440[uVar3].text,1,local_440[uVar3].length,_stderr);
      fwrite("\'\n",2,1,_stderr);
      fwrite("Please type response: ",0x16,1,_stderr);
      fgets(buf,0x400,_stdin);
      sVar1 = strlen(buf);
      while (((sVar1 != 0 && ((byte)buf[sVar1 - 1] < 0xe)) &&
             ((0x2401U >> ((byte)buf[sVar1 - 1] & 0x1f) & 1) != 0))) {
        sVar1 = sVar1 - 1;
      }
      buf[sVar1] = '\0';
      pcVar2 = strdup(buf);
      responses[uVar3].text = pcVar2;
      responses[uVar3].length = (uint)sVar1;
      fprintf(_stderr,"Response %d from user is \'",uVar3 & 0xffffffff);
      fwrite(responses[uVar3].text,1,(ulong)responses[uVar3].length,_stderr);
      fwrite("\'\n\n",3,1,_stderr);
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)num_prompts);
  }
  fwrite("Done. Sending keyboard-interactive responses to server now.\n",0x3c,1,_stderr);
  return;
}

Assistant:

static void kbd_callback(const char *name, int name_len,
                         const char *instruction, int instruction_len,
                         int num_prompts,
                         const LIBSSH2_USERAUTH_KBDINT_PROMPT *prompts,
                         LIBSSH2_USERAUTH_KBDINT_RESPONSE *responses,
                         void **abstract)
{
    int i;
    size_t n;
    char buf[1024];
    (void)abstract;

    fprintf(stderr, "Performing keyboard-interactive authentication.\n");

    fprintf(stderr, "Authentication name: '");
    fwrite(name, 1, name_len, stderr);
    fprintf(stderr, "'\n");

    fprintf(stderr, "Authentication instruction: '");
    fwrite(instruction, 1, instruction_len, stderr);
    fprintf(stderr, "'\n");

    fprintf(stderr, "Number of prompts: %d\n\n", num_prompts);

    for(i = 0; i < num_prompts; i++) {
        fprintf(stderr, "Prompt %d from server: '", i);
        fwrite(prompts[i].text, 1, prompts[i].length, stderr);
        fprintf(stderr, "'\n");

        fprintf(stderr, "Please type response: ");
        fgets(buf, sizeof(buf), stdin);
        n = strlen(buf);
        while(n > 0 && strchr("\r\n", buf[n - 1]))
            n--;
        buf[n] = 0;

        responses[i].text = strdup(buf);
        responses[i].length = (unsigned int)n;

        fprintf(stderr, "Response %d from user is '", i);
        fwrite(responses[i].text, 1, responses[i].length, stderr);
        fprintf(stderr, "'\n\n");
    }

    fprintf(stderr,
        "Done. Sending keyboard-interactive responses to server now.\n");
}